

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O1

void EstimateError2(structure_light *StructureLightCalib,structlight *StructlightMeasure,
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *BackProjectError,int imageCount)

{
  double dVar1;
  double dVar2;
  pointer pvVar3;
  double *pdVar4;
  double dVar5;
  pointer pPVar6;
  ostream *poVar7;
  pointer pvVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  float fVar16;
  double dVar17;
  double dVar18;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> calcPoint;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  A_pointcloud;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  U;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  V;
  vector<float,_std::allocator<float>_> BackProjectErrorTemp;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> CrossPoint;
  vector<double,_std::allocator<double>_> S;
  ofstream outfile;
  Mat imagetemp;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> local_538;
  _InputArray local_518;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_4f8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_4d8;
  value_type local_4b8;
  int local_4a0;
  int local_49c;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> local_498;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_480;
  double local_478;
  double local_470;
  vector<double,_std::allocator<double>_> local_468;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_450;
  undefined1 local_438 [8];
  iterator iStack_430;
  double *local_428;
  undefined8 uStack_420;
  ios_base local_340 [272];
  vector<double,_std::allocator<double>_> local_230 [4];
  structlight local_1d0;
  
  local_498.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_480 = BackProjectError;
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator=
            (&local_498,&StructureLightCalib->lightPlanePoint);
  local_538.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_538.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_538.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cv::Mat::Mat(&local_1d0.cameraIntrinsic,&StructlightMeasure->cameraIntrinsic);
  cv::Mat::Mat(&local_1d0.distCoeffs,&StructlightMeasure->distCoeffs);
  local_1d0.lightPlaneFormular[0] = StructlightMeasure->lightPlaneFormular[0];
  local_1d0.lightPlaneFormular[1] = StructlightMeasure->lightPlaneFormular[1];
  local_1d0.lightPlaneFormular[2] = StructlightMeasure->lightPlaneFormular[2];
  local_1d0.lightPlaneFormular[3] = StructlightMeasure->lightPlaneFormular[3];
  cv::Mat::Mat(&local_1d0.Rw,&StructlightMeasure->Rw);
  cv::Mat::Mat(&local_1d0.Tw,&StructlightMeasure->Tw);
  calc3DCoordination(&local_1d0,
                     (StructureLightCalib->lightPlaneSubpixelImagePoint).
                     super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4,&local_538);
  structlight::~structlight(&local_1d0);
  local_438 = (undefined1  [8])&local_428;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_438,"./light_picture/light4.jpg","");
  cv::imread((string *)local_230,(int)local_438);
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438);
  }
  pvVar3 = (StructureLightCalib->lightPlaneSubpixelImagePoint).
           super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar6 = pvVar3[4].super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar3[4].super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
               _M_impl.super__Vector_impl_data + 8) != pPVar6) {
    uVar12 = 0;
    do {
      local_518.sz.width = 0;
      local_518.sz.height = 0;
      local_518.flags = 0x3010000;
      local_518.obj = local_230;
      local_4a0 = (int)ROUND(pPVar6[uVar12].x);
      local_49c = (int)ROUND(pPVar6[uVar12].y);
      local_438 = (undefined1  [8])0x0;
      iStack_430._M_current = (double *)0x406fe00000000000;
      local_428 = (double *)0x0;
      uStack_420 = 0;
      cv::circle(&local_518,&local_4a0,1,local_438,1,8,0);
      uVar12 = uVar12 + 1;
      pvVar3 = (StructureLightCalib->lightPlaneSubpixelImagePoint).
               super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar6 = pvVar3[4].super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)*(pointer *)
                                     ((long)&pvVar3[4].
                                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                             ._M_impl.super__Vector_impl_data + 8) - (long)pPVar6 >>
                             3));
  }
  local_438 = (undefined1  [8])&local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"./save/imagetemp.jpg","");
  local_518.sz.width = 0;
  local_518.sz.height = 0;
  local_518.flags = 0x1010000;
  local_518.obj = local_230;
  local_4f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cv::imwrite((string *)local_438,&local_518,(vector *)&local_4f8);
  if (local_4f8.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4f8.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438);
  }
  local_518._0_8_ = (pointer)0x0;
  local_518.obj = (pointer)0x0;
  local_518.sz.width = 0;
  local_518.sz.height = 0;
  if (local_538.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      local_538.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
      .super__Vector_impl_data._M_start) {
    lVar10 = 0;
    uVar12 = 0;
    do {
      local_438 = (undefined1  [8])0x0;
      iStack_430._M_current = (double *)0x0;
      local_428 = (double *)0x0;
      local_4f8.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(double)*(float *)((long)&(local_538.
                                               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->x +
                                      lVar10);
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                ((vector<double,_std::allocator<double>_> *)local_438,(iterator)0x0,
                 (double *)&local_4f8);
      local_4f8.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(double)*(float *)((long)&(local_538.
                                               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->y +
                                      lVar10);
      if (iStack_430._M_current == local_428) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_438,iStack_430,
                   (double *)&local_4f8);
      }
      else {
        *iStack_430._M_current =
             (double)local_4f8.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        iStack_430._M_current = iStack_430._M_current + 1;
      }
      local_4f8.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(double)*(float *)((long)&(local_538.
                                               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->z +
                                      lVar10);
      if (iStack_430._M_current == local_428) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_438,iStack_430,
                   (double *)&local_4f8);
      }
      else {
        *iStack_430._M_current =
             (double)local_4f8.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        iStack_430._M_current = iStack_430._M_current + 1;
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&local_518,(vector<double,_std::allocator<double>_> *)local_438);
      if (local_438 != (undefined1  [8])0x0) {
        operator_delete((void *)local_438);
      }
      uVar12 = uVar12 + 1;
      uVar9 = ((long)local_538.
                     super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_538.
                     super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      lVar10 = lVar10 + 0xc;
    } while (uVar12 <= uVar9 && uVar9 - uVar12 != 0);
  }
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  lVar10 = ((long)local_518.obj - local_518._0_8_ >> 3) * -0x5555555555555555;
  if (local_518.obj == (void *)local_518._0_8_) {
    local_470 = 0.0;
    local_478 = 0.0;
    dVar17 = 0.0;
  }
  else {
    lVar11 = lVar10 + (ulong)(lVar10 == 0);
    dVar17 = 0.0;
    local_478 = 0.0;
    local_470 = 0.0;
    pvVar8 = (pointer)local_518._0_8_;
    do {
      pdVar4 = *(double **)&pvVar8->super__Vector_base<double,_std::allocator<double>_>;
      dVar17 = dVar17 + *pdVar4;
      local_470 = local_470 + pdVar4[1];
      local_478 = local_478 + pdVar4[2];
      pvVar8 = pvVar8 + 1;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  auVar15._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar15._0_8_ = lVar10;
  auVar15._12_4_ = 0x45300000;
  dVar5 = (auVar15._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0);
  dVar17 = dVar17 / dVar5;
  local_470 = local_470 / dVar5;
  local_478 = local_478 / dVar5;
  local_4f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_518.obj != (void *)local_518._0_8_) {
    lVar10 = lVar10 + (ulong)(lVar10 == 0);
    pvVar8 = (pointer)local_518._0_8_;
    do {
      pdVar4 = *(double **)&pvVar8->super__Vector_base<double,_std::allocator<double>_>;
      *pdVar4 = *pdVar4 - dVar17;
      pdVar4[1] = pdVar4[1] - local_470;
      pdVar4[2] = pdVar4[2] - local_478;
      pvVar8 = pvVar8 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_450,
           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&local_518);
  svd(&local_450,1,&local_4f8,&local_468,&local_4d8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_450);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_2a214,0xe)
  ;
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," [ ",3);
  poVar7 = std::ostream::_M_insert<double>
                     (*((local_4d8.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  poVar7 = std::ostream::_M_insert<double>
                     (((local_4d8.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  poVar7 = std::ostream::_M_insert<double>
                     (((local_4d8.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ] ",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  lVar10 = 0;
  do {
    fVar16 = *(float *)((long)&local_498.
                               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[0x1c].x + lVar10) -
             (local_538.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->x;
    fVar13 = *(float *)((long)&local_498.
                               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[0x1c].y + lVar10) -
             (local_538.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->y;
    fVar14 = *(float *)((long)&local_498.
                               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[0x1c].z + lVar10) -
             (local_538.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->z;
    fVar13 = fVar14 * fVar14 + fVar16 * fVar16 + fVar13 * fVar13;
    if (fVar13 < 0.0) {
      sqrtf(fVar13);
    }
    pdVar4 = ((local_4d8.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    dVar5 = *pdVar4;
    dVar1 = pdVar4[1];
    dVar2 = pdVar4[2];
    dVar18 = (double)(float)(-((local_478 -
                               (double)*(float *)((long)&local_498.
                                                                                                                  
                                                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x1c].z
                                                 + lVar10)) * dVar2 +
                              (dVar17 - (double)*(float *)((long)&local_498.
                                                                                                                                    
                                                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x1c].x
                                                  + lVar10)) * dVar5 +
                              (local_470 -
                              (double)*(float *)((long)&local_498.
                                                                                                                
                                                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x1c].y
                                                + lVar10)) * dVar1) /
                            (dVar2 * dVar2 + dVar5 * dVar5 + dVar1 * dVar1));
    fVar16 = *(float *)((long)&local_498.
                               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[0x1c].x + lVar10) -
             (float)(dVar5 * dVar18 + dVar17);
    fVar14 = *(float *)((long)&local_498.
                               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[0x1c].y + lVar10) -
             (float)(dVar1 * dVar18 + local_470);
    fVar13 = *(float *)((long)&local_498.
                               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[0x1c].z + lVar10) -
             (float)(dVar2 * dVar18 + local_478);
    fVar13 = fVar13 * fVar13 + fVar16 * fVar16 + fVar14 * fVar14;
    if (fVar13 < 0.0) {
      fVar13 = sqrtf(fVar13);
    }
    else {
      fVar13 = SQRT(fVar13);
    }
    local_438._0_4_ = fVar13;
    if (local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)&local_4b8,
                 (iterator)
                 local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,(float *)local_438);
    }
    else {
      *local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = fVar13;
      local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_2a24c,0x12);
    poVar7 = std::ostream::_M_insert<double>((double)(float)local_438._0_4_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    lVar10 = lVar10 + 0xc;
  } while (lVar10 != 0x54);
  uVar12 = (long)local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  if (local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    fVar13 = 0.0;
  }
  else {
    fVar13 = 0.0;
    lVar10 = 0;
    do {
      fVar13 = fVar13 + local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar10];
      lVar10 = lVar10 + 1;
    } while (uVar12 + (uVar12 == 0) != lVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_2a263,0xe)
  ;
  poVar7 = std::ostream::_M_insert<double>((double)(fVar13 / (float)uVar12));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::push_back(local_480,&local_4b8);
  std::ofstream::ofstream(local_438);
  std::ofstream::open(local_438,0x11038f);
  lVar10 = 0;
  do {
    poVar7 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)&local_498.
                                                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x1c].x
                                          + lVar10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          ",10);
    poVar7 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)&local_498.
                                                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x1c].y
                                          + lVar10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          ",10);
    poVar7 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)&local_498.
                                                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[0x1c].z
                                          + lVar10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    lVar10 = lVar10 + 0xc;
  } while (lVar10 != 0x54);
  if (local_538.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      local_538.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
      .super__Vector_impl_data._M_start) {
    lVar10 = 0;
    uVar12 = 0;
    do {
      poVar7 = std::ostream::_M_insert<double>
                         ((double)*(float *)((long)&(local_538.
                                                                                                          
                                                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->x +
                                            lVar10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          ",10);
      poVar7 = std::ostream::_M_insert<double>
                         ((double)*(float *)((long)&(local_538.
                                                                                                          
                                                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->y +
                                            lVar10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          ",10);
      poVar7 = std::ostream::_M_insert<double>
                         ((double)*(float *)((long)&(local_538.
                                                                                                          
                                                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->z +
                                            lVar10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      uVar12 = uVar12 + 1;
      uVar9 = ((long)local_538.
                     super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_538.
                     super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      lVar10 = lVar10 + 0xc;
    } while (uVar12 <= uVar9 && uVar9 - uVar12 != 0);
  }
  std::ofstream::close();
  local_438 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_438 + (long)_VTT[-3]) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&iStack_430);
  std::ios_base::~ios_base(local_340);
  if (local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_4b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_4d8);
  if (local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_468.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_4f8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_518);
  cv::Mat::~Mat((Mat *)local_230);
  if (local_538.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_538.
                    super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_498.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.
                    super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void EstimateError2(structure_light StructureLightCalib, structlight StructlightMeasure, vector<vector<float>> BackProjectError, int imageCount)
{
	/* 评估之前定义靶标的列数和评估的图像编号 */
	int BoardRow = 7;
	int ImageNum = 4;
	/* 首先取出光条和每列圆斑的交点的三维坐标，这是标定（拟合平面）用的 */
	vector<Point3f> CrossPoint;//光条和每列圆斑的交点的三维坐标（所有图的）
	CrossPoint = StructureLightCalib.lightPlanePoint;
	/* 用拟合出来的平面计算光条中心的三维坐标 */
	vector<Point3f> calcPoint;//第ImageNum张图光条中心的三维坐标
	calc3DCoordination(StructlightMeasure, StructureLightCalib.lightPlaneSubpixelImagePoint[ImageNum], calcPoint);
	Mat imagetemp = imread("./light_picture/light4.jpg");
	for (int ii = 0; ii < StructureLightCalib.lightPlaneSubpixelImagePoint[ImageNum].size(); ii++)
	{
		circle(imagetemp, StructureLightCalib.lightPlaneSubpixelImagePoint[ImageNum][ii], 1, Scalar(0, 255, 0));
	}
	imwrite("./save/imagetemp.jpg", imagetemp);
	/*################# 对重构的点云进行直线拟合 #################*/
	/*把坐标转换成矩阵 N*3的矩阵 */
	vector<vector<double>> A_pointcloud;
	for (int i = 0; i < calcPoint.size(); i++)
	{
		vector<double> A_pointcloudTemp;
		A_pointcloudTemp.push_back(calcPoint[i].x);
		A_pointcloudTemp.push_back(calcPoint[i].y);
		A_pointcloudTemp.push_back(calcPoint[i].z);
		A_pointcloud.push_back(A_pointcloudTemp);
	}
	cout << A_pointcloud.size() << endl;
	/* 拟合的直线必过所有坐标的算数平均值 得到直线上一点 */
	double LineX0, LineY0, LineZ0, X_sum = 0, Y_sum = 0, Z_sum = 0;
	for (int i = 0; i < A_pointcloud.size(); i++)
	{
		X_sum = X_sum + A_pointcloud[i][0];
		Y_sum = Y_sum + A_pointcloud[i][1];
		Z_sum = Z_sum + A_pointcloud[i][2];
	}
	LineX0 = X_sum / A_pointcloud.size();
	LineY0 = Y_sum / A_pointcloud.size();
	LineZ0 = Z_sum / A_pointcloud.size();//平均值就是直线经过的点

	/* 协方差矩阵奇异变换（SVD分解）得到直线方向向量 */
	vector<vector<double> > U;
	vector<double> S;
	vector<vector<double> > V;
	for (int i = 0; i < A_pointcloud.size(); i++)
	{
		A_pointcloud[i][0] = A_pointcloud[i][0] - LineX0;
		A_pointcloud[i][1] = A_pointcloud[i][1] - LineY0;
		A_pointcloud[i][2] = A_pointcloud[i][2] - LineZ0;
	}
	svd(A_pointcloud, 1, U, S, V);
	cout << "V矩阵大小 " << V.size() << " [ " << V[0][0] << " " << V[0][1] << " " << V[0][2] << " ] " << endl;
	//直线方程 (x - x0)/m = (y - y0)/n = (z - z0)/p = t ;x0,y0,z0是LineX0，LineY0，LineZ0；m,n,p对应这V的三个元素
	/*################# 拟合完成 #################*/
	/* 计算点之间的最小距离 评估误差 */
	vector<float> BackProjectErrorTemp;
	for (int i = ImageNum * BoardRow; i < (ImageNum + 1) * BoardRow; i++)
	{
		float MinDistacne = sqrt((CrossPoint[i].x - calcPoint[0].x)*(CrossPoint[i].x - calcPoint[0].x)
			+ (CrossPoint[i].y - calcPoint[0].y)*(CrossPoint[i].y - calcPoint[0].y)
			+ (CrossPoint[i].z - calcPoint[0].z)*(CrossPoint[i].z - calcPoint[0].z));
		float t, Xc, Yc, Zc;//t直线方程的参数，Xc,Yc,Zc是标定用的点做直线的垂线的垂足；下边是计算公式，目的是计算标定用点到拟合直线的距离
		t = -(V[0][0] * (LineX0 - CrossPoint[i].x) + V[0][1] * (LineY0 - CrossPoint[i].y) + V[0][2] * (LineZ0 - CrossPoint[i].z)) / (V[0][0] * V[0][0] + V[0][1] * V[0][1] + V[0][2] * V[0][2]);
		Xc = V[0][0] * t + LineX0;
		Yc = V[0][1] * t + LineY0;
		Zc = V[0][2] * t + LineZ0;
		float distance = sqrt((CrossPoint[i].x - Xc)*(CrossPoint[i].x - Xc)
			+ (CrossPoint[i].y - Yc)*(CrossPoint[i].y - Yc)
			+ (CrossPoint[i].z - Zc)*(CrossPoint[i].z - Zc));
		BackProjectErrorTemp.push_back(distance);
		cout << "点到线的距离" << distance << endl;
	}
	/* 计算7个点的平均距离 */
	float DistanceSum = 0, DistanceMaen = 0;
	for (int i = 0; i < BackProjectErrorTemp.size(); i++)
	{
		DistanceSum = DistanceSum + BackProjectErrorTemp[i];
	}
	DistanceMaen = DistanceSum / BackProjectErrorTemp.size();
	cout << "平均距离: " << DistanceMaen << endl;
	BackProjectError.push_back(BackProjectErrorTemp);

	// 将三维坐标写入TXT文件中
	ofstream outfile;
	outfile.open("pointcloud2.txt", ios::binary | ios::in | ios::out);
	for (int k = ImageNum * BoardRow; k < (ImageNum + 1) * BoardRow; k++)
	{
		outfile << CrossPoint[k].x << "          ";
		outfile << CrossPoint[k].y << "          ";
		outfile << CrossPoint[k].z << "\n";
	}
	for (int k = 0; k < calcPoint.size(); k++)
	{
		outfile << calcPoint[k].x << "          ";
		outfile << calcPoint[k].y << "          ";
		outfile << calcPoint[k].z << "\n";
	}
	outfile.close();

}